

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O3

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAligned
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  long lVar1;
  void *pvVar2;
  SerialArena *this_00;
  ulong uVar3;
  long *in_FS_OFFSET;
  
  uVar3 = *(ulong *)(this + 8);
  if ((uVar3 & 2) == 0) {
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -0x38) == *(long *)this) {
      this_00 = *(SerialArena **)(lVar1 + -0x30);
    }
    else {
      this_00 = *(SerialArena **)(this + 0x18);
      if ((this_00 == (SerialArena *)0x0) || (this_00->owner_ != (void *)(lVar1 + -0x40)))
      goto LAB_0035feef;
      uVar3 = *(ulong *)(this + 8);
    }
    pvVar2 = SerialArena::AllocateAligned
                       (this_00,n,(AllocationPolicy *)(uVar3 & 0xfffffffffffffff8));
    return pvVar2;
  }
LAB_0035feef:
  pvVar2 = AllocateAlignedFallback(this,n,type);
  return pvVar2;
}

Assistant:

void* AllocateAligned(size_t n, const std::type_info* type) {
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                              GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, AllocPolicy());
    } else {
      return AllocateAlignedFallback(n, type);
    }
  }